

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::RandomBernoulli(Tensor *val,real p,real scale)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  
  pfVar1 = val->v;
  uVar2 = Dim::size(&val->d);
  for (lVar3 = 0; (ulong)uVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    dVar4 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (rndeng);
    *(uint *)((long)pfVar1 + lVar3) = (uint)(dVar4 < (double)p) * (int)scale;
  }
  return;
}

Assistant:

void TensorTools::RandomBernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
  generate(val.v, val.v + val.d.size(), b);
}